

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perfect.hpp
# Opt level: O0

void __thiscall
Lib::
Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>::
Perfect(Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
        *this,Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *elem)

{
  Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  *in_RSI;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *in_RDI;
  Option<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_&>
  *this_00;
  anon_class_8_1_898b388d f;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> **in_stack_ffffffffffffffa0;
  Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  *in_stack_ffffffffffffffa8;
  Option<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_&>
  local_40;
  undefined1 local_38 [56];
  
  this_00 = &local_40;
  Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  ::tryGet(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  f.elem = (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_38;
  Option<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_&>
  ::toOwned(this_00);
  Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
  ::
  unwrapOrElse<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>::unwrapOrElse(Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>)::_lambda()_1_>
            (in_RSI,f);
  Perfect(in_RDI,(Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                  *)(local_38 + 0x18));
  Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ::~Option((Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
             *)0x379f33);
  return;
}

Assistant:

explicit Perfect(T elem) 
    : Perfect(_ids.tryGet(&elem).toOwned()
        .unwrapOrElse([&](){
            auto entry = Perfect(_ids.size(),  new T(std::move(elem)));
            _ids.insert(entry._ptr, entry);
            DEBUG(*elemPtr, " -> ", T::className(),"#",entry._id);
            return entry;
          })) 
    { }